

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_cdata<0>(xml_document<char> *this,char **text)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  xml_node<char> *pxVar4;
  undefined8 *puVar5;
  
  pcVar1 = *text;
  pcVar2 = pcVar1;
  do {
    pcVar3 = pcVar2 + 1;
    if (*pcVar2 == ']') {
      if ((*pcVar3 == ']') && (pcVar2[2] == '>')) {
        pxVar4 = (xml_node<char> *)
                 memory_pool<char>::allocate_aligned(&this->super_memory_pool<char>,0x60);
        (pxVar4->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
        (pxVar4->super_xml_base<char>).m_name = (char *)0x0;
        (pxVar4->super_xml_base<char>).m_value = (char *)0x0;
        pxVar4->m_type = node_cdata;
        pxVar4->m_first_node = (xml_node<char> *)0x0;
        pxVar4->m_first_attribute = (xml_attribute<char> *)0x0;
        pcVar2 = *text;
        (pxVar4->super_xml_base<char>).m_value = pcVar1;
        (pxVar4->super_xml_base<char>).m_value_size = (long)pcVar2 - (long)pcVar1;
        **text = '\0';
        *text = *text + 3;
        return pxVar4;
      }
    }
    else if (*pcVar2 == '\0') {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
      pcVar1 = *text;
      *puVar5 = &PTR__exception_00b74cc8;
      puVar5[1] = "unexpected end of data";
      puVar5[2] = pcVar1;
      __cxa_throw(puVar5,&parse_error::typeinfo,std::exception::~exception);
    }
    *text = pcVar3;
    pcVar2 = pcVar3;
  } while( true );
}

Assistant:

xml_node<Ch> *parse_cdata(Ch *&text)
        {
            // If CDATA is disabled
            if (Flags & parse_no_data_nodes)
            {
                // Skip until end of cdata
                while (text[0] != Ch(']') || text[1] != Ch(']') || text[2] != Ch('>'))
                {
                    if (!text[0])
                        RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                    ++text;
                }
                text += 3;      // Skip ]]>
                return 0;       // Do not produce CDATA node
            }

            // Skip until end of cdata
            Ch *value = text;
            while (text[0] != Ch(']') || text[1] != Ch(']') || text[2] != Ch('>'))
            {
                if (!text[0])
                    RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                ++text;
            }

            // Create new cdata node
            xml_node<Ch> *cdata = this->allocate_node(node_cdata);
            cdata->value(value, text - value);

            // Place zero terminator after value
            if (!(Flags & parse_no_string_terminators))
                *text = Ch('\0');

            text += 3;      // Skip ]]>
            return cdata;
        }